

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O0

void init_spur_command(void)

{
  g_spur.x = 0.0;
  g_spur.y = 0.0;
  g_spur.theta = 0.0;
  g_spur.v = 0.0;
  g_spur.w = 0.0;
  g_spur.radius = 0.0;
  g_spur.tilt = 0.0;
  g_spur.dir = 0.0;
  g_spur.run_mode = RUN_STOP;
  g_spur.before_run_mode = 0xffffd8f0;
  g_spur.freeze = 0;
  g_spur.before_freeze = 0;
  g_spur.run_mode_cnt = 0;
  pthread_mutex_init((pthread_mutex_t *)&g_spur.mutex,(pthread_mutexattr_t *)0x0);
  return;
}

Assistant:

void init_spur_command(void)
{
  g_spur.x = 0;
  g_spur.y = 0;
  g_spur.theta = 0;
  g_spur.v = 0;
  g_spur.w = 0;
  g_spur.radius = 0;
  g_spur.tilt = 0;
  g_spur.dir = 0;
  g_spur.run_mode = RUN_STOP;
  g_spur.before_run_mode = -10000;
  g_spur.freeze = 0;
  g_spur.before_freeze = 0;
  g_spur.run_mode_cnt = 0;
  pthread_mutex_init(&g_spur.mutex, NULL);
}